

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_class_base(writer *w,TypeDef *type)

{
  bool bVar1;
  bool bVar2;
  size_t in_RCX;
  void *__buf;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_98 [2];
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  reference local_58;
  TypeDef *base;
  iterator __end1;
  iterator __begin1;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range1;
  bool first;
  TypeDef *type_local;
  writer *w_local;
  
  bVar1 = true;
  get_bases((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)&__begin1,
            type);
  __end1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::begin
                     ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                      &__begin1);
  base = (TypeDef *)
         std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end
                   ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                    &__begin1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                                *)&base);
    if (!bVar2) break;
    local_58 = __gnu_cxx::
               __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
               ::operator*(&__end1);
    if (bVar1) {
      bVar1 = false;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_68,",\n        impl::base<%");
      sVar3 = winmd::reader::TypeDef::TypeName(type);
      local_78._M_str = sVar3._M_str;
      in_RCX = sVar3._M_len;
      local_78._M_len = in_RCX;
      writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_68,&local_78);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98,", %");
    writer_base<cppwinrt::writer>::write<winmd::reader::TypeDef>
              (&w->super_writer_base<cppwinrt::writer>,local_98,local_58);
    __gnu_cxx::
    __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
    ::operator++(&__end1);
  }
  std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::~vector
            ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)&__begin1);
  if (!bVar1) {
    writer_base<cppwinrt::writer>::write(&w->super_writer_base<cppwinrt::writer>,0x3e,__buf,in_RCX);
  }
  return;
}

Assistant:

static void write_class_base(writer& w, TypeDef const& type)
    {
        bool first = true;

        for (auto&& base : get_bases(type))
        {
            if (first)
            {
                first = false;
                w.write(",\n        impl::base<%", type.TypeName());
            }

            w.write(", %", base);
        }

        if (!first)
        {
            w.write('>');
        }
    }